

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integral_helper.h
# Opt level: O2

uint tLeft(vector<unsigned_int,_std::allocator<unsigned_int>_> *t,int l)

{
  int iVar1;
  ulong uVar2;
  
  if (-1 < l) {
    iVar1 = 0;
    for (uVar2 = 0; l + -1 + (uint)(l == 0) != uVar2; uVar2 = uVar2 + 1) {
      iVar1 = iVar1 + (t->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                      super__Vector_impl_data._M_start[uVar2] + 1;
    }
    return iVar1 - 1;
  }
  __assert_fail("l >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/sebawild[P]quickselect-integral-equation/integral_helper.h"
                ,0x62,"unsigned int tLeft(vector<unsigned int>, int)");
}

Assistant:

unsigned int tLeft(vector<unsigned int> t, int l) {
	assert(l >= 0);
	unsigned int res = 0;
	for (int i = 0; i < l-1; ++i) {
		res += t[i] + 1;
	}
	return res - 1;
}